

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

int __thiscall kj::anon_unknown_31::WebSocketPipeImpl::Aborted::close(Aborted *this,int __fd)

{
  char (*in_RCX) [41];
  undefined4 in_register_00000034;
  String local_1a0;
  Exception local_188;
  undefined8 uStack_28;
  uint16_t code_local;
  Aborted *this_local;
  StringPtr reason_local;
  
  uStack_28 = CONCAT44(in_register_00000034,__fd);
  reason_local.content.size_ = (size_t)this;
  _::Debug::makeDescription<char_const(&)[41]>
            (&local_1a0,(Debug *)"\"other end of WebSocketPipe was destroyed\"",
             "other end of WebSocketPipe was destroyed",in_RCX);
  Exception::Exception
            (&local_188,DISCONNECTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
             ,0xbe5,&local_1a0);
  Promise<void>::Promise((Promise<void> *)this,&local_188);
  Exception::~Exception(&local_188);
  String::~String(&local_1a0);
  return (int)this;
}

Assistant:

kj::Promise<void> close(uint16_t code, kj::StringPtr reason) override {
      return KJ_EXCEPTION(DISCONNECTED, "other end of WebSocketPipe was destroyed");
    }